

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseIncoming.cpp
# Opt level: O0

Result __thiscall tonk::SessionIncoming::resumeProcessing(SessionIncoming *this)

{
  long lVar1;
  char *pcVar2;
  long in_RSI;
  ErrorResult *in_RDI;
  uint8_t *messageData;
  uint messageBytes;
  uint messageType;
  ReadByteStream frameReader;
  int getResult;
  SiameseOriginalPacket packet;
  Result *result;
  uint16_t value;
  uint8_t *data;
  LogStringBuffer buffer;
  char *in_stack_fffffffffffffa48;
  LogStringBuffer *in_stack_fffffffffffffa50;
  undefined4 in_stack_fffffffffffffa58;
  ErrorType in_stack_fffffffffffffa5c;
  SessionIncoming *in_stack_fffffffffffffa60;
  ErrorResult *desc;
  uint8_t *in_stack_fffffffffffffa68;
  ErrorResult *in_stack_fffffffffffffa70;
  ErrorResult *pEVar3;
  undefined7 in_stack_fffffffffffffa78;
  undefined1 in_stack_fffffffffffffa7f;
  LogStringBuffer *in_stack_fffffffffffffa88;
  OutputWorker *in_stack_fffffffffffffa90;
  undefined1 local_4d1 [33];
  uint local_4b0;
  undefined1 local_4a9;
  uint8_t *local_4a8;
  allocator local_499;
  string local_498 [32];
  uint local_478;
  uint local_474;
  ReadByteStream local_470;
  string local_460 [55];
  allocator local_429;
  string local_428 [35];
  undefined1 local_405;
  SiameseResult local_404;
  undefined4 local_400;
  uint local_3fc;
  uint8_t *local_3f8;
  long local_3d0;
  undefined4 local_3c4;
  string *local_3c0;
  char *local_3b8;
  undefined8 local_398;
  undefined4 local_38c;
  string *local_388;
  char *local_380;
  undefined8 local_360;
  undefined4 local_354;
  undefined1 *local_350;
  char *local_348;
  ReadByteStream *local_330;
  ReadByteStream *local_328;
  ReadByteStream *local_320;
  ushort local_312;
  ReadByteStream *local_310;
  ushort *local_308;
  uint8_t *local_300;
  uint local_2f4;
  ReadByteStream *local_2f0;
  ReadByteStream *local_2e8;
  ReadByteStream *local_2e0;
  ReadByteStream *local_2d8;
  string *local_2d0;
  char *local_2c8;
  long local_2c0;
  uint local_2b4;
  ReadByteStream *local_2b0;
  string *local_2a8;
  char *local_2a0;
  undefined4 local_294;
  long local_290;
  undefined4 local_284;
  long local_280;
  undefined1 local_268 [16];
  ostream aoStack_258 [376];
  string *local_e0;
  char *local_d8;
  undefined4 local_cc;
  long local_c8;
  string *local_c0;
  char *local_b8;
  string *local_b0;
  undefined1 *local_a8;
  long local_a0;
  string *local_98;
  undefined1 *local_90;
  long local_88;
  string *local_80;
  undefined1 *local_78;
  string *local_70;
  char *local_68;
  undefined1 *local_60;
  long local_58;
  string *local_50;
  undefined1 *local_48;
  long local_40;
  string *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  long local_18;
  char *local_10;
  undefined1 *local_8;
  
  while( true ) {
    local_400 = *(undefined4 *)(in_RSI + 0x270);
    local_404 = siamese_decoder_get((SiameseDecoder)
                                    CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                                    (SiameseOriginalPacket *)in_stack_fffffffffffffa50);
    if (local_404 == Siamese_NeedMoreData) {
      Result::Success();
      return (Result)in_RDI;
    }
    if (local_404 != Siamese_Success) break;
    *(undefined8 *)(in_RSI + 0x6290) = 0;
    *(uint *)(in_RSI + 0x270) = *(int *)(in_RSI + 0x270) + 1U & 0x3fffff;
    siamese::ReadByteStream::ReadByteStream(&local_470,local_3f8,(ulong)local_3fc);
    while (local_320 = &local_470, 1 < local_470.BufferBytes - local_470.BytesRead) {
      local_310 = &local_470;
      local_308 = (ushort *)(local_470.Data + local_470.BytesRead);
      local_312 = *local_308;
      local_470.BytesRead = local_470.BytesRead + 2;
      local_474 = (uint)local_312;
      local_478 = local_474 & 0x7ff;
      local_328 = &local_470;
      local_2e0 = local_310;
      if (local_470.BufferBytes - local_470.BytesRead < local_478) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_498,"Truncated message",&local_499);
        local_380 = "SessionIncoming::resumeProcessing";
        local_388 = local_498;
        local_38c = 0;
        local_398 = 9;
        pEVar3 = in_RDI;
        pcVar2 = (char *)operator_new(0x38);
        ErrorResult::ErrorResult
                  (in_stack_fffffffffffffa70,(char *)in_stack_fffffffffffffa68,
                   (string *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa5c,
                   (ErrorCodeT)in_stack_fffffffffffffa50);
        pEVar3->Source = pcVar2;
        std::__cxx11::string::~string(local_498);
        std::allocator<char>::~allocator((allocator<char> *)&local_499);
        return (Result)in_RDI;
      }
      local_474 = (uint)(local_312 >> 0xb);
      local_2f0 = &local_470;
      local_4a8 = local_470.Data + local_470.BytesRead;
      local_470.BytesRead = local_478 + local_470.BytesRead;
      local_300 = local_4a8;
      local_2f4 = local_478;
      local_2e8 = local_2f0;
      local_2b4 = local_478;
      local_2b0 = local_2f0;
      if ((4 < local_474) && (local_474 != 0x1f)) {
        local_4a9 = Tonk;
        handleReliableMessage
                  ((SessionIncoming *)CONCAT17(in_stack_fffffffffffffa7f,in_stack_fffffffffffffa78),
                   (uint)((ulong)in_stack_fffffffffffffa70 >> 0x20),in_stack_fffffffffffffa68,
                   (uint)((ulong)in_stack_fffffffffffffa60 >> 0x20));
        in_stack_fffffffffffffa7f = in_RDI->Source != (char *)0x0;
        if ((bool)in_stack_fffffffffffffa7f) {
          local_4a9 = Siamese;
        }
        local_4b0 = (uint)(byte)in_stack_fffffffffffffa7f;
        if ((local_4a9 & Siamese) == Tonk) {
          Result::~Result((Result *)in_stack_fffffffffffffa50);
        }
        if (local_4b0 != 0) {
          return (Result)in_RDI;
        }
      }
    }
    local_330 = &local_470;
    if (local_470.BufferBytes != local_470.BytesRead) {
      pEVar3 = (ErrorResult *)local_4d1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_4d1 + 1),"Invalid frame",(allocator *)pEVar3);
      local_348 = "SessionIncoming::resumeProcessing";
      local_350 = local_4d1 + 1;
      local_354 = 0;
      local_360 = 9;
      desc = in_RDI;
      pcVar2 = (char *)operator_new(0x38);
      ErrorResult::ErrorResult
                (pEVar3,pcVar2,(string *)desc,in_stack_fffffffffffffa5c,
                 (ErrorCodeT)in_stack_fffffffffffffa50);
      desc->Source = pcVar2;
      std::__cxx11::string::~string((string *)(local_4d1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_4d1);
      return (Result)in_RDI;
    }
    local_2d8 = &local_470;
    insertUncompressed(in_stack_fffffffffffffa60,
                       (uint8_t *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
  }
  local_405 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_428,"siamese_decoder_get failed",&local_429);
  local_3d0 = (long)(int)local_404;
  local_3b8 = "SessionIncoming::resumeProcessing";
  local_3c0 = local_428;
  local_3c4 = 1;
  pcVar2 = (char *)operator_new(0x38);
  ErrorResult::ErrorResult
            (in_stack_fffffffffffffa70,(char *)in_stack_fffffffffffffa68,
             (string *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa5c,
             (ErrorCodeT)in_stack_fffffffffffffa50);
  in_RDI->Source = pcVar2;
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  lVar1 = *(long *)(in_RSI + 0x28);
  Result::ToJson_abi_cxx11_((Result *)CONCAT17(in_stack_fffffffffffffa7f,in_stack_fffffffffffffa78))
  ;
  local_2c8 = "siamese_decoder_get failed: ";
  local_2d0 = local_460;
  local_294 = 4;
  local_2a0 = "siamese_decoder_get failed: ";
  local_284 = 4;
  local_2c0 = lVar1;
  local_2a8 = local_2d0;
  local_290 = lVar1;
  local_280 = lVar1;
  if (*(int *)(lVar1 + 8) < 5) {
    local_cc = 4;
    local_d8 = "siamese_decoder_get failed: ";
    local_e0 = local_2d0;
    local_c8 = lVar1;
    logger::LogStringBuffer::LogStringBuffer
              (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,Trace);
    local_b0 = (string *)(lVar1 + 0x38);
    local_a8 = local_268;
    local_b8 = local_d8;
    local_c0 = local_e0;
    local_a0 = lVar1;
    local_98 = local_b0;
    local_90 = local_a8;
    local_88 = lVar1;
    local_80 = local_b0;
    local_78 = local_a8;
    std::operator<<(aoStack_258,local_b0);
    local_60 = local_a8;
    local_68 = local_b8;
    local_70 = local_c0;
    local_20 = local_a8;
    local_28 = local_b8;
    local_8 = local_a8;
    local_10 = local_b8;
    local_58 = lVar1;
    local_18 = lVar1;
    std::operator<<((ostream *)(local_a8 + 0x10),local_b8);
    local_48 = local_60;
    local_50 = local_70;
    local_30 = local_60;
    local_38 = local_70;
    local_40 = lVar1;
    std::operator<<((ostream *)(local_60 + 0x10),local_70);
    logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
    logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1dcef6);
  }
  std::__cxx11::string::~string(local_460);
  return (Result)in_RDI;
}

Assistant:

Result SessionIncoming::resumeProcessing()
{
    // Run processing loop
    for (;;)
    {
        SiameseOriginalPacket packet;
        packet.PacketNum = FECNextExpectedPacketNum;

        // See if we already have the next one in sequence
        const int getResult = siamese_decoder_get(FECDecoder, &packet);

        if (getResult == Siamese_NeedMoreData) {
            break;
        }

        if (getResult != Siamese_Success)
        {
            const Result result = Result("SessionIncoming::resumeProcessing", "siamese_decoder_get failed", ErrorType::Siamese, getResult);
            Deps.Logger->Error("siamese_decoder_get failed: ", result.ToJson());
            TONK_DEBUG_BREAK();
            return result;
        }

        // Reset the compression state machine
        FirstReliable = nullptr;

        // Increment the next expected packet number
        FECNextExpectedPacketNum = SIAMESE_PACKET_NUM_INC(FECNextExpectedPacketNum);

        siamese::ReadByteStream frameReader(packet.Data, packet.DataBytes);

        // Process all messages contained in the datagram:
        while (frameReader.Remaining() >= protocol::kMessageFrameBytes)
        {
            // Read message frame header
            unsigned messageType = frameReader.Read16();
            const unsigned messageBytes = messageType & protocol::kMessageLengthMask;

            if (frameReader.Remaining() < messageBytes) {
                TONK_DEBUG_BREAK();
                return Result("SessionIncoming::resumeProcessing", "Truncated message", ErrorType::Tonk, Tonk_InvalidData);
            }

            messageType >>= protocol::kMessageLengthBits;
            const uint8_t* messageData = frameReader.Read(messageBytes);

            /*
                When processing data at this stage, unreliable and unordered data
                has already been delivered for sure, so we can skip it here.

                Unordered (reliable) data specifically might arrive five ways:

                (1) In sequence -> Delivered right away
                (2) Out of sequence original (not seen yet) -> Delivered right away
                (3) Out of sequence original (but seen already) -> Not delivered
                (4) Recovered by FEC (not seen yet) -> Delivered right away
                (5) After FEC recovery (already seen) -> Not delivered

                Cases (3) and (5) are what we are handling with this check.
            */
            if (messageType < protocol::MessageType_StartOfReliables ||
                messageType == protocol::MessageType_Unordered)
            {
                continue;
            }

            const Result result = handleReliableMessage(
                messageType,
                messageData,
                messageBytes);
            if (result.IsFail()) {
                return result;
            }
        }

        // If the message payload was not completely used:
        if (frameReader.Remaining() > 0)
        {
            TONK_DEBUG_BREAK(); // Invalid data
            return Result("SessionIncoming::resumeProcessing", "Invalid frame", ErrorType::Tonk, Tonk_InvalidData);
        }

        // Insert remaining uncompressed bytes
        insertUncompressed(frameReader.Peek());
    }

    return Result::Success();
}